

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *p,Gia_Obj_t *pObj,int f,int fUseId)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  void **ppvVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iLitOut;
  uint local_40;
  int local_3c;
  Gia_Obj_t *local_38;
  
  local_3c = f;
  local_40 = Ga2_ObjFindLit(p,pObj,f);
  if (local_40 == 0xffffffff) {
    iVar7 = p->nSatVars;
    p->nSatVars = iVar7 + 1;
    local_40 = iVar7 * 2;
    Ga2_ObjAddLit(p,pObj,local_3c,local_40);
  }
  if ((int)local_40 < 2) {
    __assert_fail("iLitOut > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x31d,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
  }
  uVar1 = *(ulong *)pObj;
  if ((uVar1 & 0x1fffffff1fffffff) != 0x1fffffff1fffffff) {
    uVar10 = (uint)uVar1;
    uVar9 = (uint)(uVar1 >> 0x20);
    if ((((uVar10 & 0x9fffffff) != 0x9fffffff) ||
        ((int)(uVar9 & 0x1fffffff) < p->pGia->vCis->nSize - p->pGia->nRegs)) &&
       (((int)uVar10 < 0 || ((uVar10 & 0x1fffffff) == 0x1fffffff)))) {
      __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x31e,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
    }
    if (((uVar1 & 0x1fffffff1fffffff) != 0x1fffffff1fffffff) &&
       (((uVar10 & 0x9fffffff) != 0x9fffffff || local_3c != 0 ||
        ((int)(uVar9 & 0x1fffffff) < p->pGia->vCis->nSize - p->pGia->nRegs)))) {
      p->vLits->nSize = 0;
      Ga2_ObjLeaves(p->pGia,pObj);
      if (0 < Ga2_ObjLeaves::v.nSize) {
        bVar6 = true;
        lVar11 = 0;
        local_38 = pObj;
        do {
          iVar7 = Ga2_ObjLeaves::v.pArray[lVar11];
          if (((long)iVar7 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
          iVar12 = 0;
          if (((uint)*(undefined8 *)local_38 & 0x9fffffff) == 0x9fffffff) {
            iVar12 = -(uint)(pGVar3->vCis->nSize - pGVar3->nRegs <=
                            (int)((uint)((ulong)*(undefined8 *)local_38 >> 0x20) & 0x1fffffff));
          }
          pGVar2 = pGVar3->pObjs + iVar7;
          iVar12 = iVar12 + local_3c;
          iVar7 = Ga2_ObjFindLit(p,pGVar2,iVar12);
          if (iVar7 == -1) {
            iVar7 = p->nSatVars;
            p->nSatVars = iVar7 + 1;
            iVar7 = iVar7 * 2;
            Ga2_ObjAddLit(p,pGVar2,iVar12,iVar7);
          }
          Vec_IntPush(p->vLits,iVar7);
          if (iVar7 < 2) {
            bVar6 = false;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < Ga2_ObjLeaves::v.nSize);
        pGVar2 = local_38;
        pObj = local_38;
        if (!bVar6) {
          pGVar3 = p->pGia;
          if ((((uint)*(undefined8 *)local_38 & 0x9fffffff) != 0x9fffffff) ||
             ((int)((uint)((ulong)*(undefined8 *)local_38 >> 0x20) & 0x1fffffff) <
              pGVar3->vCis->nSize - pGVar3->nRegs)) {
            uVar10 = Ga2_ObjComputeTruthSpecial(pGVar3,local_38,&Ga2_ObjLeaves::v,p->vLits);
            pGVar5 = p->pGia->pObjs;
            if ((pGVar5 <= pGVar2) && (pGVar2 < pGVar5 + p->pGia->nObjs)) {
              Ga2_ManCnfAddDynamic
                        (p,uVar10 & 0xffff,p->vLits->pArray,local_40,
                         (int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555);
              return;
            }
            goto LAB_005f54bb;
          }
        }
      }
      pGVar2 = p->pGia->pObjs;
      if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pGia->nObjs)) {
        uVar10 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
        if (((int)uVar10 < 0) || (p->vIds->nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar9 = p->vIds->pArray[uVar10 & 0x7fffffff];
        if ((int)uVar9 < 0) {
          __assert_fail("Ga2_ObjId(p,pObj) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x57,"Vec_Int_t *Ga2_ObjCnf0(Ga2_Man_t *, Gia_Obj_t *)");
        }
        iVar7 = p->vCnfs->nSize;
        if (((int)(uVar9 * 2) < iVar7) && (uVar8 = uVar9 * 2 | 1, (int)uVar8 < iVar7)) {
          ppvVar4 = p->vCnfs->pArray;
          Ga2_ManCnfAddStatic(p->pSat,(Vec_Int_t *)ppvVar4[(ulong)uVar9 * 2],
                              (Vec_Int_t *)ppvVar4[uVar8],p->vLits->pArray,local_40,uVar10);
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      goto LAB_005f54bb;
    }
  }
  local_40 = local_40 ^ 1;
  pGVar2 = p->pGia->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pGia->nObjs)) {
    sat_solver2_addclause
              (p->pSat,(lit *)&local_40,&local_3c,
               (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
    return;
  }
LAB_005f54bb:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Ga2_ManAddToAbsOneStatic( Ga2_Man_t * p, Gia_Obj_t * pObj, int f, int fUseId )
{
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pLeaf;
    int k, Lit, iLitOut = Ga2_ObjFindOrAddLit( p, pObj, f );
    assert( iLitOut > 1 );
    assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsConst0(pObj) || (f == 0 && Gia_ObjIsRo(p->pGia, pObj)) )
    {
        iLitOut = Abc_LitNot( iLitOut );
        sat_solver2_addclause( p->pSat, &iLitOut, &iLitOut + 1, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
    }
    else
    {
        int fUseStatic = 1;
        Vec_IntClear( p->vLits );
        vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pLeaf, k )
        {
            Lit = Ga2_ObjFindOrAddLit( p, pLeaf, f - Gia_ObjIsRo(p->pGia, pObj) );
            Vec_IntPush( p->vLits, Lit );
            if ( Lit < 2 )
                fUseStatic = 0;
        }
        if ( fUseStatic || Gia_ObjIsRo(p->pGia, pObj) )
            Ga2_ManCnfAddStatic( p->pSat, Ga2_ObjCnf0(p, pObj), Ga2_ObjCnf1(p, pObj), Vec_IntArray(p->vLits), iLitOut, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
        else
        {
            unsigned uTruth = Ga2_ObjComputeTruthSpecial( p->pGia, pObj, vLeaves, p->vLits );
            Ga2_ManCnfAddDynamic( p, uTruth & 0xFFFF, Vec_IntArray(p->vLits), iLitOut, Gia_ObjId(p->pGia, pObj) );
        }
    }
}